

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

natwm_error workspace_list_init(natwm_state *state,workspace_list **result)

{
  workspace_list *workspace_list_00;
  workspace *pwVar1;
  workspace *workspace;
  size_t i;
  workspace_list *workspace_list;
  config_array *workspace_names;
  workspace_list **result_local;
  natwm_state *state_local;
  
  workspace_list = (workspace_list *)0x0;
  workspace_names = (config_array *)result;
  result_local = (workspace_list **)state;
  config_find_array(state->config,"workspaces",(config_array **)&workspace_list);
  workspace_list_00 = workspace_list_create(10);
  if (workspace_list_00 == (workspace_list *)0x0) {
    state_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    for (workspace = (workspace *)0x0; workspace < (workspace *)0xa;
        workspace = (workspace *)((long)&workspace->name + 1)) {
      pwVar1 = workspace_init((config_array *)workspace_list,(size_t)workspace);
      if (pwVar1 == (workspace *)0x0) {
        workspace_list_destroy(workspace_list_00);
        return MEMORY_ALLOCATION_ERROR;
      }
      workspace_list_00->workspaces[(long)workspace] = pwVar1;
    }
    attach_to_monitors((monitor_list *)result_local[5],workspace_list_00);
    ewmh_update_current_desktop((natwm_state *)result_local,workspace_list_00->active_index);
    ewmh_update_desktop_names((natwm_state *)result_local,workspace_list_00);
    reset_input_focus((natwm_state *)result_local);
    workspace_names->length = (size_t)workspace_list_00;
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error workspace_list_init(const struct natwm_state *state,
                                     struct workspace_list **result)
{
        // First get the list of workspace names
        const struct config_array *workspace_names = NULL;

        config_find_array(state->config, "workspaces", &workspace_names);

        struct workspace_list *workspace_list = workspace_list_create(NATWM_WORKSPACE_COUNT);

        if (workspace_list == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        for (size_t i = 0; i < NATWM_WORKSPACE_COUNT; ++i) {
                struct workspace *workspace = workspace_init(workspace_names, i);

                if (workspace == NULL) {
                        workspace_list_destroy(workspace_list);

                        return MEMORY_ALLOCATION_ERROR;
                }

                workspace_list->workspaces[i] = workspace;
        }

        attach_to_monitors(state->monitor_list, workspace_list);

        ewmh_update_current_desktop(state, workspace_list->active_index);
        ewmh_update_desktop_names(state, workspace_list);

        reset_input_focus(state);

        *result = workspace_list;

        return NO_ERROR;
}